

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.hpp
# Opt level: O2

__string_type *
qclab::qasm2<double>
          (__string_type *__return_storage_ptr__,char *type,int qubit0,int qubit1,double angle)

{
  ostream *poVar1;
  char *this;
  stringstream stream;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,type);
  this = "(";
  poVar1 = std::operator<<(poVar1,"(");
  qasm_abi_cxx11_(&local_1c8,(qclab *)this,angle);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  poVar1 = std::operator<<(poVar1,") q[");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,qubit0);
  poVar1 = std::operator<<(poVar1,"], q[");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,qubit1);
  std::operator<<(poVar1,"];\n");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline auto qasm2( const char type[] , const int qubit0 , const int qubit1 ,
                     const T angle ) {
    std::stringstream stream ;
    stream << type << "(" << qasm( angle ) << ") q[" << qubit0 << "], q["
                                                     << qubit1 << "];\n" ;
    return stream.str() ;
  }